

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

VisitReturn __thiscall QMakeEvaluator::testFunc_cache(QMakeEvaluator *this,ProStringList *args)

{
  QMakeGlobals *pQVar1;
  QMakeEvaluator *this_00;
  char16_t *pcVar2;
  Data *pDVar3;
  byte bVar4;
  byte bVar5;
  QArrayDataPointer<ProString> *other;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  storage_type_conflict *psVar9;
  qsizetype qVar10;
  bool bVar11;
  compare_eq_result_container<QList<ProString>,_ProString> cVar12;
  bool bVar13;
  VisitReturn VVar14;
  qsizetype qVar15;
  ProValueMap *pPVar16;
  QMakeBaseEnv *pQVar17;
  QArrayDataPointer<ProString> *this_01;
  QList<ProString> *pQVar18;
  storage_type *psVar19;
  char *pcVar20;
  ProString *vval;
  char *data;
  QString *pQVar21;
  int iVar22;
  ProString *pPVar23;
  long lVar24;
  ProString *this_02;
  long in_FS_OFFSET;
  QStringView vals;
  QLatin1String other_00;
  QLatin1String other_01;
  QLatin1String other_02;
  QLatin1String other_03;
  QLatin1String other_04;
  QLatin1String other_05;
  QLatin1String other_06;
  QLatin1String other_07;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  int local_1ac;
  ProString local_168;
  QStringBuilder<QString_&,_QLatin1String> local_130;
  undefined1 local_118 [32];
  ProKey dstvar;
  QStringView local_c8;
  qsizetype local_b8;
  ProKey srcvar;
  QMakeBaseKey local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  srcvar.super_ProString.m_file = -0x55555556;
  srcvar.super_ProString._36_4_ = 0xaaaaaaaa;
  srcvar.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
  srcvar.super_ProString.m_string.d.size = -0x5555555555555556;
  srcvar.super_ProString.m_offset = -0x55555556;
  srcvar.super_ProString.m_length = -0x55555556;
  srcvar.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  srcvar.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString::ProString(&srcvar.super_ProString);
  if ((ulong)(args->super_QList<ProString>).d.size < 2) {
    bVar5 = 1;
    local_1ac = 1;
    iVar22 = 0;
  }
  else {
    local_78.root.d.size = -0x5555555555555556;
    local_78.root.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_78.root.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pPVar23 = (args->super_QList<ProString>).d.ptr;
    dstvar.super_ProString.m_string.d.ptr = pPVar23[1].m_string.d.ptr;
    dstvar.super_ProString.m_string.d.d = (Data *)pPVar23[1].m_string.d.size;
    vals = QStringView::mid((QStringView *)&dstvar,(long)pPVar23[1].m_offset,
                            (long)pPVar23[1].m_length);
    iVar22 = 0;
    split_value_list((ProStringList *)&local_78,this,vals,0);
    bVar5 = 1;
    local_1ac = 1;
    pPVar23 = (ProString *)local_78.root.d.ptr;
    for (lVar24 = local_78.root.d.size * 0x30; lVar24 != 0; lVar24 = lVar24 + -0x30) {
      qVar15 = QtPrivate::lengthHelperPointer<char>("transient");
      other_00.m_data = "transient";
      other_00.m_size = qVar15;
      bVar11 = ProString::operator==(pPVar23,other_00);
      if (bVar11) {
        bVar5 = 0;
      }
      else {
        qVar15 = QtPrivate::lengthHelperPointer<char>("super");
        other_01.m_data = "super";
        other_01.m_size = qVar15;
        bVar11 = ProString::operator==(pPVar23,other_01);
        if (bVar11) {
          local_1ac = 2;
        }
        else {
          qVar15 = QtPrivate::lengthHelperPointer<char>("stash");
          other_02.m_data = "stash";
          other_02.m_size = qVar15;
          bVar11 = ProString::operator==(pPVar23,other_02);
          if (bVar11) {
            local_1ac = 0;
          }
          else {
            qVar15 = QtPrivate::lengthHelperPointer<char>("set");
            other_03.m_data = "set";
            other_03.m_size = qVar15;
            bVar11 = ProString::operator==(pPVar23,other_03);
            if (bVar11) {
              iVar22 = 0;
            }
            else {
              qVar15 = QtPrivate::lengthHelperPointer<char>("add");
              other_04.m_data = "add";
              other_04.m_size = qVar15;
              bVar11 = ProString::operator==(pPVar23,other_04);
              if (bVar11) {
                iVar22 = 1;
              }
              else {
                qVar15 = QtPrivate::lengthHelperPointer<char>("sub");
                other_05.m_data = "sub";
                other_05.m_size = qVar15;
                bVar11 = ProString::operator==(pPVar23,other_05);
                iVar22 = 2;
                if (!bVar11) {
                  psVar19 = (storage_type *)
                            QByteArrayView::lengthHelperCharArray("cache(): invalid flag %1.",0x1a);
                  this_02 = &local_168;
                  QVar28.m_data = psVar19;
                  QVar28.m_size = (qsizetype)this_02;
                  QString::fromLatin1(QVar28);
                  dstvar.super_ProString.m_string.d.ptr = (pPVar23->m_string).d.ptr;
                  dstvar.super_ProString.m_string.d.d = (Data *)(pPVar23->m_string).d.size;
                  local_c8 = QStringView::mid((QStringView *)&dstvar,(long)pPVar23->m_offset,
                                              (long)pPVar23->m_length);
                  QString::arg<QStringView,_true>
                            ((QString *)&dstvar,&this_02->m_string,&local_c8,0,(QChar)0x20);
                  evalError(this,(QString *)&dstvar);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&dstvar);
                  goto LAB_001ea3fa;
                }
              }
            }
          }
        }
      }
      pPVar23 = pPVar23 + 1;
    }
    if ((ulong)(args->super_QList<ProString>).d.size < 3) {
      if (iVar22 != 0) {
        psVar19 = (storage_type *)
                  QByteArrayView::lengthHelperCharArray
                            ("cache(): modes other than \'set\' require a source variable.",0x3b);
        this_02 = &dstvar.super_ProString;
        QVar25.m_data = psVar19;
        QVar25.m_size = (qsizetype)this_02;
        QString::fromLatin1(QVar25);
        evalError(this,&this_02->m_string);
LAB_001ea3fa:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_02);
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_78);
        VVar14 = ReturnFalse;
        goto LAB_001eabc1;
      }
    }
    else {
      ProString::operator=(&srcvar.super_ProString,(args->super_QList<ProString>).d.ptr + 2);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_78);
  }
  local_c8 = (QStringView)ZEXT816(0);
  local_b8 = 0;
  dstvar.super_ProString.m_file = -0x55555556;
  dstvar.super_ProString._36_4_ = 0xaaaaaaaa;
  dstvar.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
  dstvar.super_ProString.m_string.d.size = -0x5555555555555556;
  dstvar.super_ProString.m_offset = -0x55555556;
  dstvar.super_ProString.m_length = -0x55555556;
  dstvar.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  dstvar.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString::ProString(&dstvar.super_ProString,(args->super_QList<ProString>).d.ptr);
  if (dstvar.super_ProString.m_length == 0) {
LAB_001ea8df:
    local_118._0_16_ = ZEXT816(0);
    local_118._16_8_ = 0;
    if (local_1ac == 1) {
      pQVar21 = &this->m_cachefile;
      if ((this->m_cachefile).d.size == 0) {
        local_130.b.m_size = QtPrivate::lengthHelperPointer<char>("/.qmake.cache");
        local_130.b.m_data = "/.qmake.cache";
        local_130.a = &this->m_outputDir;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>(&local_168.m_string,&local_130)
        ;
        QDir::cleanPath((QString *)&local_78);
        pDVar3 = (this->m_cachefile).d.d;
        pPVar23 = (ProString *)(this->m_cachefile).d.ptr;
        (this->m_cachefile).d.d = local_78.root.d.d;
        (this->m_cachefile).d.ptr = local_78.root.d.ptr;
        qVar15 = (this->m_cachefile).d.size;
        (this->m_cachefile).d.size = local_78.root.d.size;
        local_78.root.d.d = pDVar3;
        local_78.root.d.ptr = (char16_t *)pPVar23;
        local_78.root.d.size = qVar15;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        QDir::toNativeSeparators((QString *)&local_168);
        QString::toLocal8Bit((QByteArray *)&local_78,&local_168.m_string);
        pPVar23 = (ProString *)local_78.root.d.ptr;
        if ((ProString *)local_78.root.d.ptr == (ProString *)0x0) {
          pPVar23 = (ProString *)&QByteArray::_empty;
        }
        printf("Info: creating cache file %s\n",pPVar23);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        pcVar20 = "_QMAKE_CACHE_";
LAB_001eaaf0:
        ProKey::ProKey((ProKey *)&local_78,pcVar20);
        pQVar18 = &valuesRef(this,(ProKey *)&local_78)->super_QList<ProString>;
        ProString::ProString(&local_168,pQVar21);
        QList<ProString>::emplaceBack<ProString_const&>(pQVar18,&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      }
LAB_001eab39:
      QString::operator=((QString *)local_118,(QString *)pQVar21);
    }
    else {
      if (local_1ac == 2) {
        pQVar21 = &this->m_superfile;
        if ((this->m_superfile).d.size == 0) {
          local_130.b.m_size = QtPrivate::lengthHelperPointer<char>("/.qmake.super");
          local_130.b.m_data = "/.qmake.super";
          local_130.a = &this->m_outputDir;
          QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                    (&local_168.m_string,&local_130);
          QDir::cleanPath((QString *)&local_78);
          pDVar3 = (this->m_superfile).d.d;
          pPVar23 = (ProString *)(this->m_superfile).d.ptr;
          (this->m_superfile).d.d = local_78.root.d.d;
          (this->m_superfile).d.ptr = local_78.root.d.ptr;
          qVar15 = (this->m_superfile).d.size;
          (this->m_superfile).d.size = local_78.root.d.size;
          local_78.root.d.d = pDVar3;
          local_78.root.d.ptr = (char16_t *)pPVar23;
          local_78.root.d.size = qVar15;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168)
          ;
          QDir::toNativeSeparators((QString *)&local_168);
          QString::toLocal8Bit((QByteArray *)&local_78,&local_168.m_string);
          pPVar23 = (ProString *)local_78.root.d.ptr;
          if ((ProString *)local_78.root.d.ptr == (ProString *)0x0) {
            pPVar23 = (ProString *)&QByteArray::_empty;
          }
          printf("Info: creating super cache file %s\n",pPVar23);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168)
          ;
          pcVar20 = "_QMAKE_SUPER_CACHE_";
          goto LAB_001eaaf0;
        }
        goto LAB_001eab39;
      }
      QString::operator=((QString *)local_118,(QString *)&this->m_stashfile);
      if (local_118._16_8_ == 0) {
        local_130.b.m_size = QtPrivate::lengthHelperPointer<char>("/.qmake.stash");
        local_130.b.m_data = "/.qmake.stash";
        local_130.a = &this->m_outputDir;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>(&local_168.m_string,&local_130)
        ;
        QDir::cleanPath((QString *)&local_78);
        uVar8 = local_118._16_8_;
        uVar6 = local_118._0_8_;
        uVar7 = local_118._8_8_;
        local_118._8_8_ = local_78.root.d.ptr;
        local_118._0_8_ = local_78.root.d.d;
        local_78.root.d.d = (Data *)uVar6;
        local_78.root.d.ptr = (char16_t *)uVar7;
        local_118._16_8_ = local_78.root.d.size;
        local_78.root.d.size = uVar8;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
      }
      bVar11 = QMakeVfs::exists(this->m_vfs,(QString *)local_118,(VfsFlags)0x0);
      if (!bVar11) {
        QDir::toNativeSeparators((QString *)&local_168);
        QString::toLocal8Bit((QByteArray *)&local_78,&local_168.m_string);
        pPVar23 = (ProString *)local_78.root.d.ptr;
        if ((ProString *)local_78.root.d.ptr == (ProString *)0x0) {
          pPVar23 = (ProString *)&QByteArray::_empty;
        }
        printf("Info: creating stash file %s\n",pPVar23);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        ProKey::ProKey((ProKey *)&local_78,"_QMAKE_STASH_");
        pQVar18 = &valuesRef(this,(ProKey *)&local_78)->super_QList<ProString>;
        ProString::ProString(&local_168,(QString *)local_118);
        QList<ProString>::emplaceBack<ProString_const&>(pQVar18,&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      }
    }
    psVar19 = (storage_type *)QByteArrayView::lengthHelperCharArray("cache ",7);
    QVar27.m_data = psVar19;
    QVar27.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar27);
    pPVar23 = (ProString *)local_118;
    VVar14 = writeFile(this,&local_78.root,(QString *)pPVar23,(OpenMode)0x4,(VfsFlags)0x0,
                       (QString *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
LAB_001eaba2:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar23);
  }
  else {
    if (srcvar.super_ProString.m_length == 0) {
      ProString::operator=(&srcvar.super_ProString,&dstvar.super_ProString);
    }
    local_130.a = (QString *)0x0;
    pPVar16 = findValues(this,&srcvar,(Iterator *)&local_130);
    pQVar21 = local_130.a;
    if (pPVar16 == (ProValueMap *)0x0) {
      psVar19 = (storage_type *)
                QByteArrayView::lengthHelperCharArray("Variable %1 is not defined.",0x1c);
      pPVar23 = &local_168;
      QVar26.m_data = psVar19;
      QVar26.m_size = (qsizetype)pPVar23;
      QString::fromLatin1(QVar26);
      local_78.root.d.d = (Data *)srcvar.super_ProString.m_string.d.size;
      local_78.root.d.ptr = srcvar.super_ProString.m_string.d.ptr;
      local_118._0_16_ =
           (undefined1  [16])
           QStringView::mid((QStringView *)&local_78,(long)srcvar.super_ProString.m_offset,
                            (long)srcvar.super_ProString.m_length);
      VVar14 = ReturnFalse;
      QString::arg<QStringView,_true>
                (&local_78.root,&pPVar23->m_string,(QStringView *)local_118,0,(QChar)0x20);
      evalError(this,&local_78.root);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      goto LAB_001eaba2;
    }
    other = (QArrayDataPointer<ProString> *)((long)(local_130.a + 3) + 8);
    local_168.m_string.d.size = 0;
    local_168.m_string.d.d = (Data *)0x0;
    local_168.m_string.d.ptr = (char16_t *)0x0;
    bVar4 = 0;
    bVar11 = false;
    do {
      pQVar1 = this->m_option;
      QMakeBaseKey::QMakeBaseKey(&local_78,&this->m_buildRoot,&this->m_stashfile,bVar11);
      pQVar17 = QHash<QMakeBaseKey,_QMakeBaseEnv_*>::value(&pQVar1->baseEnvs,&local_78);
      QMakeBaseKey::~QMakeBaseKey(&local_78);
      if (pQVar17 != (QMakeBaseEnv *)0x0) {
        this_00 = pQVar17->evaluator;
        values((ProStringList *)&local_78,this_00,&dstvar);
        if (iVar22 == 0) {
          QArrayDataPointer<ProString>::operator=((QArrayDataPointer<ProString> *)&local_168,other);
        }
        else {
          QArrayDataPointer<ProString>::operator=
                    ((QArrayDataPointer<ProString> *)&local_168,
                     (QArrayDataPointer<ProString> *)&local_78);
          if (iVar22 == 1) {
            QList<ProString>::append((QList<ProString> *)&local_168,(QList<ProString> *)other);
          }
          else {
            ProStringList::removeEach((ProStringList *)&local_168,(ProStringList *)other);
          }
        }
        cVar12 = QList<ProString>::operator!=
                           ((QList<ProString> *)&local_78,(QList<ProString> *)&local_168);
        if (cVar12) {
          if ((local_1ac != 0) || ((this->m_stashfile).d.size != 0)) {
            this_01 = (QArrayDataPointer<ProString> *)
                      valuesRef(this_00,(ProKey *)&dstvar.super_ProString);
            QArrayDataPointer<ProString>::operator=
                      (this_01,(QArrayDataPointer<ProString> *)&local_168);
            if (local_1ac == 2) {
              qVar15 = QtPrivate::lengthHelperPointer<char>("QMAKEPATH");
              other_06.m_data = "QMAKEPATH";
              other_06.m_size = qVar15;
              bVar13 = ProString::operator==(&dstvar.super_ProString,other_06);
              if (bVar13) {
                ProStringList::toQStringList((QStringList *)local_118,(ProStringList *)&local_168);
                QArrayDataPointer<QString>::operator=
                          (&(this_00->m_qmakepath).d,(QArrayDataPointer<QString> *)local_118);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_118);
                updateMkspecPaths(this_00);
              }
              else {
                qVar15 = QtPrivate::lengthHelperPointer<char>("QMAKEFEATURES");
                other_07.m_data = "QMAKEFEATURES";
                other_07.m_size = qVar15;
                bVar13 = ProString::operator==(&dstvar.super_ProString,other_07);
                if (!bVar13) goto LAB_001ea709;
                ProStringList::toQStringList((QStringList *)local_118,(ProStringList *)&local_168);
                QArrayDataPointer<QString>::operator=
                          (&(this_00->m_qmakefeatures).d,(QArrayDataPointer<QString> *)local_118);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_118);
              }
              updateFeaturePaths(this_00);
              if (this->m_hostBuild == bVar11) {
                QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator=
                          (&this->m_featureRoots,&this_00->m_featureRoots);
              }
            }
          }
LAB_001ea709:
          bVar4 = 1;
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_78);
      }
      bVar13 = bVar11 == false;
      bVar11 = true;
    } while (bVar13);
    if ((bool)(bVar5 & bVar4)) {
      ProString::toQString(&local_78.root,&dstvar.super_ProString);
      qVar10 = local_b8;
      qVar15 = local_c8.m_size;
      psVar9 = local_c8.m_data;
      local_c8.m_data = local_78.root.d.ptr;
      local_c8.m_size = (qsizetype)local_78.root.d.d;
      local_78.root.d.d = (Data *)qVar15;
      local_78.root.d.ptr = psVar9;
      local_b8 = local_78.root.d.size;
      local_78.root.d.size = qVar10;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      pcVar20 = " =";
      if (iVar22 == 2) {
        pcVar20 = " -=";
      }
      data = " +=";
      if (iVar22 != 1) {
        data = pcVar20;
      }
      QtPrivate::lengthHelperPointer<char>(data);
      QString::append((QLatin1String *)&local_c8);
      pcVar2 = *(char16_t **)(pQVar21 + 4);
      if (pcVar2 != (char16_t *)0x0) {
        if (pcVar2 == (char16_t *)0x1) {
          QString::append((QChar)(char16_t)&local_c8);
          quoteValue(&local_78.root,*(ProString **)((long)(pQVar21 + 3) + 0x10));
          QString::append((QString *)&local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        }
        else {
          pPVar23 = *(ProString **)((long)(pQVar21 + 3) + 0x10);
          for (lVar24 = (long)pcVar2 * 0x30; lVar24 != 0; lVar24 = lVar24 + -0x30) {
            QtPrivate::lengthHelperPointer<char>(" \\\n    ");
            QString::append((QLatin1String *)&local_c8);
            quoteValue(&local_78.root,pPVar23);
            QString::append((QString *)&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_78);
            pPVar23 = pPVar23 + 1;
          }
        }
      }
      QString::append((QChar)(char16_t)&local_c8);
      VVar14 = ReturnFalse;
    }
    else {
      VVar14 = ReturnTrue;
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_168);
    if ((bool)(bVar5 & bVar4)) goto LAB_001ea8df;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dstvar);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
LAB_001eabc1:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&srcvar);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return VVar14;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::testFunc_cache(const ProStringList &args)
{
    bool persist = true;
    enum { TargetStash, TargetCache, TargetSuper } target = TargetCache;
    enum { CacheSet, CacheAdd, CacheSub } mode = CacheSet;
    ProKey srcvar;
    if (args.size() >= 2) {
        const auto opts = split_value_list(args.at(1).toQStringView());
        for (const ProString &opt : opts) {
            if (opt == QLatin1String("transient")) {
                persist = false;
            } else if (opt == QLatin1String("super")) {
                target = TargetSuper;
            } else if (opt == QLatin1String("stash")) {
                target = TargetStash;
            } else if (opt == QLatin1String("set")) {
                mode = CacheSet;
            } else if (opt == QLatin1String("add")) {
                mode = CacheAdd;
            } else if (opt == QLatin1String("sub")) {
                mode = CacheSub;
            } else {
                evalError(fL1S("cache(): invalid flag %1.").arg(opt.toQStringView()));
                return ReturnFalse;
            }
        }
        if (args.size() >= 3) {
            srcvar = args.at(2).toKey();
        } else if (mode != CacheSet) {
            evalError(fL1S("cache(): modes other than 'set' require a source variable."));
            return ReturnFalse;
        }
    }
    QString varstr;
    ProKey dstvar = args.at(0).toKey();
    if (!dstvar.isEmpty()) {
        if (srcvar.isEmpty())
            srcvar = dstvar;
        ProValueMap::Iterator srcvarIt;
        if (!findValues(srcvar, &srcvarIt)) {
            evalError(fL1S("Variable %1 is not defined.").arg(srcvar.toQStringView()));
            return ReturnFalse;
        }
        // The caches for the host and target may differ (e.g., when we are manipulating
        // CONFIG), so we cannot compute a common new value for both.
        const ProStringList &diffval = *srcvarIt;
        ProStringList newval;
        bool changed = false;
        for (bool hostBuild = false; ; hostBuild = true) {
#ifdef PROEVALUATOR_THREAD_SAFE
            m_option->mutex.lock();
#endif
            QMakeBaseEnv *baseEnv =
                m_option->baseEnvs.value(QMakeBaseKey(m_buildRoot, m_stashfile, hostBuild));
#ifdef PROEVALUATOR_THREAD_SAFE
            // It's ok to unlock this before locking baseEnv,
            // as we have no intention to initialize the env.
            m_option->mutex.unlock();
#endif
            do {
                if (!baseEnv)
                    break;
#ifdef PROEVALUATOR_THREAD_SAFE
                QMutexLocker locker(&baseEnv->mutex);
                if (baseEnv->inProgress && baseEnv->evaluator != this) {
                    // The env is still in the works, but it may be already past the cache
                    // loading. So we need to wait for completion and amend it as usual.
                    QThreadPool::globalInstance()->releaseThread();
                    baseEnv->cond.wait(&baseEnv->mutex);
                    QThreadPool::globalInstance()->reserveThread();
                }
                if (!baseEnv->isOk)
                    break;
#endif
                QMakeEvaluator *baseEval = baseEnv->evaluator;
                const ProStringList &oldval = baseEval->values(dstvar);
                if (mode == CacheSet) {
                    newval = diffval;
                } else {
                    newval = oldval;
                    if (mode == CacheAdd)
                        newval += diffval;
                    else
                        newval.removeEach(diffval);
                }
                if (oldval != newval) {
                    if (target != TargetStash || !m_stashfile.isEmpty()) {
                        baseEval->valuesRef(dstvar) = newval;
                        if (target == TargetSuper) {
                            do {
                                if (dstvar == QLatin1String("QMAKEPATH")) {
                                    baseEval->m_qmakepath = newval.toQStringList();
                                    baseEval->updateMkspecPaths();
                                } else if (dstvar == QLatin1String("QMAKEFEATURES")) {
                                    baseEval->m_qmakefeatures = newval.toQStringList();
                                } else {
                                    break;
                                }
                                baseEval->updateFeaturePaths();
                                if (hostBuild == m_hostBuild)
                                    m_featureRoots = baseEval->m_featureRoots;
                            } while (false);
                        }
                    }
                    changed = true;
                }
            } while (false);
            if (hostBuild)
                break;
        }
        // We assume that whatever got the cached value to be what it is now will do so
        // the next time as well, so we just skip the persisting if nothing changed.
        if (!persist || !changed)
            return ReturnTrue;
        varstr = dstvar.toQString();
        if (mode == CacheAdd)
            varstr += QLatin1String(" +=");
        else if (mode == CacheSub)
            varstr += QLatin1String(" -=");
        else
            varstr += QLatin1String(" =");
        if (diffval.size() == 1) {
            varstr += QLatin1Char(' ');
            varstr += quoteValue(diffval.at(0));
        } else if (!diffval.isEmpty()) {
            for (const ProString &vval : diffval) {
                varstr += QLatin1String(" \\\n    ");
                varstr += quoteValue(vval);
            }
        }
        varstr += QLatin1Char('\n');
    }
    QString fn;
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    if (target == TargetSuper) {
        if (m_superfile.isEmpty()) {
            m_superfile = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.super"));
            printf("Info: creating super cache file %s\n", qPrintable(QDir::toNativeSeparators(m_superfile)));
            valuesRef(ProKey("_QMAKE_SUPER_CACHE_")) << ProString(m_superfile);
        }
        fn = m_superfile;
    } else if (target == TargetCache) {
        if (m_cachefile.isEmpty()) {
            m_cachefile = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.cache"));
            printf("Info: creating cache file %s\n", qPrintable(QDir::toNativeSeparators(m_cachefile)));
            valuesRef(ProKey("_QMAKE_CACHE_")) << ProString(m_cachefile);
            // We could update m_{source,build}Root and m_featureRoots here, or even
            // "re-home" our rootEnv, but this doesn't sound too useful - if somebody
            // wanted qmake to find something in the build directory, he could have
            // done so "from the outside".
            // The sub-projects will find the new cache all by themselves.
        }
        fn = m_cachefile;
    } else {
        fn = m_stashfile;
        if (fn.isEmpty())
            fn = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.stash"));
        if (!m_vfs->exists(fn, flags)) {
            printf("Info: creating stash file %s\n", qPrintable(QDir::toNativeSeparators(fn)));
            valuesRef(ProKey("_QMAKE_STASH_")) << ProString(fn);
        }
    }
    return writeFile(fL1S("cache "), fn, QIODevice::Append, flags, varstr);
}